

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_init(fdb_config *config)

{
  sb_ops ops;
  bool bVar1;
  __int_type_conflict _Var2;
  int64_t iVar3;
  filemgr_magic_t magic;
  void *in_RDI;
  undefined1 auVar4 [16];
  compactor_config c_config;
  sb_ops sb_ops;
  fdb_log_config _log_config;
  double ram_size;
  filemgr_config f_config;
  fdb_config _config;
  fdb_config *in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcb0;
  __int_type_conflict in_stack_fffffffffffffcb7;
  __atomic_base<unsigned_char> *in_stack_fffffffffffffcb8;
  _func_fdb_status_filemgr_ptr *in_stack_fffffffffffffce8;
  compactor_config local_310;
  undefined1 local_2f8 [8];
  undefined8 uStack_2f0;
  __atomic_base<unsigned_char> *local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [64];
  size_t local_278;
  fdb_log_config local_270;
  double local_268;
  undefined1 local_260 [248];
  uint local_168;
  undefined4 local_164;
  fdb_seqtree_opt_t local_157;
  byte local_110;
  uint32_t local_10c;
  fdb_config local_108;
  void *local_10;
  
  local_10 = in_RDI;
  if (in_RDI == (void *)0x0) {
    get_default_config();
    memcpy(&local_108,local_260,0xf8);
  }
  else {
    bVar1 = validate_fdb_config(in_stack_fffffffffffffca8);
    if (!bVar1) {
      return FDB_RESULT_INVALID_CONFIG;
    }
    memcpy(&local_108,local_10,0xf8);
  }
  std::__atomic_base::operator_cast_to_unsigned_char(in_stack_fffffffffffffcb8);
  pthread_spin_lock(&initial_lock);
  _Var2 = std::__atomic_base::operator_cast_to_unsigned_char(in_stack_fffffffffffffcb8);
  if (_Var2 == '\0') {
    iVar3 = get_memory_size();
    local_268 = (double)iVar3;
    auVar4._8_4_ = (int)(local_108.buffercache_size >> 0x20);
    auVar4._0_8_ = local_108.buffercache_size;
    auVar4._12_4_ = 0x45300000;
    if (local_268 * 0.8 <
        (auVar4._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)local_108.buffercache_size) - 4503599627370496.0)) {
      pthread_spin_unlock(&initial_lock);
      return FDB_RESULT_TOO_BIG_BUFFER_CACHE;
    }
    fdb_log_config::fdb_log_config(&local_270);
    local_278 = *(size_t *)((long)local_10 + 0xe0);
    local_270.log_msg_level = local_278;
    fdb_log_init((fdb_log_config)local_278);
    local_168 = local_108.blocksize;
    local_164 = (undefined4)(local_108.buffercache_size / local_108.blocksize);
    local_157 = local_108.seqtree_opt;
    local_110 = local_108.do_not_cache_doc_blocks & 1;
    local_10c = local_108.num_blocks_readahead;
    filemgr_init((filemgr_config *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
    filemgr_set_lazy_file_deletion
              ((bool)(local_108.enable_background_compactor & 1),compactor_register_file_removing,
               compactor_is_file_removed);
    magic = ver_get_latest_magic();
    bVar1 = ver_superblock_support(magic);
    if (bVar1) {
      memcpy(local_2b8,&PTR_sb_init_001b0d60,0x40);
      memcpy(local_2f8,local_2b8,0x40);
      in_stack_fffffffffffffcb0 = (undefined7)uStack_2f0;
      in_stack_fffffffffffffcb7 = (__int_type_conflict)((ulong)uStack_2f0 >> 0x38);
      ops.get_default_config = (_func_sb_config *)local_2e8;
      ops.init = (_func_fdb_status_filemgr_ptr_sb_config_err_log_callback_ptr *)uStack_2f0;
      ops.read_latest = (_func_fdb_status_filemgr_ptr_sb_config_err_log_callback_ptr *)uStack_2e0;
      ops.alloc_block = (_func_bid_t_filemgr_ptr *)local_2d8;
      ops.is_writable = (_func_bool_filemgr_ptr_bid_t *)uStack_2d0;
      ops.get_bmp_revnum = (_func_uint64_t_filemgr_ptr *)local_2c8;
      ops.get_min_live_revnum = (_func_uint64_t_filemgr_ptr *)uStack_2c0;
      ops.release = in_stack_fffffffffffffce8;
      filemgr_set_sb_operation(ops);
      sb_bmp_mask_init();
      in_stack_fffffffffffffcb8 = local_2e8;
    }
    compactor_config::compactor_config(&local_310);
    compactor_config::operator=(&local_310,&local_108);
    compactor_init((compactor_config *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0)
                  );
    std::__atomic_base<unsigned_char>::operator=
              (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb7);
  }
  pthread_spin_unlock(&initial_lock);
  return FDB_RESULT_SUCCESS;
}

Assistant:

LIBFDB_API
fdb_status fdb_init(fdb_config *config)
{
    fdb_config _config;
    struct filemgr_config f_config;

    if (config) {
        if (validate_fdb_config(config)) {
            _config = *config;
        } else {
            return FDB_RESULT_INVALID_CONFIG;
        }
    } else {
        _config = get_default_config();
    }

    // global initialization
    // initialized only once at first time
    if (!fdb_initialized) {

#ifndef SPIN_INITIALIZER
        init_initial_lock_status();
#endif

    }
    spin_lock(&initial_lock);
    if (!fdb_initialized) {
#if !defined(_ANDROID_) && !defined(__ANDROID__)
        // Some Android devices (e.g., Nexus 6) return incorrect RAM size.
        // We temporarily disable validity checking of block cache size
        // on Android platform at this time.
        double ram_size = (double) get_memory_size();
        if (ram_size * BCACHE_MEMORY_THRESHOLD < (double) _config.buffercache_size) {
            spin_unlock(&initial_lock);
            return FDB_RESULT_TOO_BIG_BUFFER_CACHE;
        }
#endif
        // Initialize log message routine.
        struct fdb_log_config _log_config;
        _log_config.log_msg_level = config->log_msg_level;
        fdb_log_init(_log_config);

        // initialize file manager and block cache
        f_config.blocksize = _config.blocksize;
        f_config.ncacheblock = _config.buffercache_size / _config.blocksize;
        f_config.seqtree_opt = _config.seqtree_opt;
        f_config.do_not_cache_doc_blocks = _config.do_not_cache_doc_blocks;
        f_config.num_blocks_readahead = _config.num_blocks_readahead;
        filemgr_init(&f_config);

        // WARNING: If background compactor is disabled,
        //          we should disable lazy deletion as well,
        //          since there will be no thread to do deletion.
        filemgr_set_lazy_file_deletion(_config.enable_background_compactor,
                                       compactor_register_file_removing,
                                       compactor_is_file_removed);
        if (ver_superblock_support(ver_get_latest_magic())) {
            struct sb_ops sb_ops = {sb_init, sb_get_default_config,
                                    sb_read_latest, sb_alloc_block,
                                    sb_bmp_is_writable, sb_get_bmp_revnum,
                                    sb_get_min_live_revnum, sb_free};
            filemgr_set_sb_operation(sb_ops);
            sb_bmp_mask_init();
        }

        // initialize compaction daemon
        compactor_config c_config;
        c_config = _config;
        compactor_init(&c_config);

        // initialize background flusher daemon
        // Temporarily disable background flushers until blockcache contention
        // issue is resolved.
        //bgf_config.num_threads = 0; //_config.num_bgflusher_threads;
        //bgflusher_init(&bgf_config);

        // Initialize breakpad
        //_dbg_handle_crashes(config->breakpad_minidump_dir);

        fdb_initialized = 1;
    }
    spin_unlock(&initial_lock);

    return FDB_RESULT_SUCCESS;
}